

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_data__fixed2x3
          (ColladaParserAutoGen15Private *this,ParserChar *text,size_t textLength)

{
  bool bVar1;
  
  bVar1 = GeneratedSaxParser::
          ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
          ::characterData2Data<float,_&GeneratedSaxParser::Utils::toFloat>
                    (&this->
                      super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                     ,text,textLength,0x80914c,0);
  return bVar1;
}

Assistant:

bool ColladaParserAutoGen15Private::_data__fixed2x3( const ParserChar* text, size_t textLength )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
        float2x3__ValidationData* validationData = (float2x3__ValidationData*)mValidationDataStack.top();
        DISABLE_WARNING_UNUSED(validationData)
return characterData2FloatData(text, textLength, &ColladaParserAutoGen15::data__fixed2x3, &validate__float2x3_type__stream, &validationData->validationWholeSize, 0);
    }
    else
    {
return characterData2FloatData(text, textLength, &ColladaParserAutoGen15::data__fixed2x3);
    }
#else
    {
return characterData2FloatData(text, textLength, &ColladaParserAutoGen15::data__fixed2x3);
    } // validation
#endif

}